

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_mono_asio_channel_select.c
# Opt level: O0

int patestCallback(void *inputBuffer,void *outputBuffer,unsigned_long framesPerBuffer,
                  PaStreamCallbackTimeInfo *timeInfo,PaStreamCallbackFlags statusFlags,
                  void *userData)

{
  ulong uStack_50;
  int finished;
  unsigned_long i;
  float *out;
  paTestData *data;
  void *userData_local;
  PaStreamCallbackFlags statusFlags_local;
  PaStreamCallbackTimeInfo *timeInfo_local;
  unsigned_long framesPerBuffer_local;
  void *outputBuffer_local;
  void *inputBuffer_local;
  
  i = (unsigned_long)outputBuffer;
  for (uStack_50 = 0; uStack_50 < framesPerBuffer; uStack_50 = uStack_50 + 1) {
    *(undefined4 *)i = *(undefined4 *)((long)userData + (long)*(int *)((long)userData + 800) * 4);
    *(int *)((long)userData + 800) = *(int *)((long)userData + 800) + 1;
    if (199 < *(int *)((long)userData + 800)) {
      *(int *)((long)userData + 800) = *(int *)((long)userData + 800) + -200;
    }
    i = i + 4;
  }
  return 0;
}

Assistant:

static int patestCallback( const void *inputBuffer, void *outputBuffer,
                            unsigned long framesPerBuffer,
                            const PaStreamCallbackTimeInfo* timeInfo,
                            PaStreamCallbackFlags statusFlags,
                            void *userData )
{
    paTestData *data = (paTestData*)userData;
    float *out = (float*)outputBuffer;
    unsigned long i;
    int finished = 0;
    /* avoid unused variable warnings */
    (void) inputBuffer;
    (void) timeInfo;
    (void) statusFlags;
    for( i=0; i<framesPerBuffer; i++ )
    {
        *out++ = data->sine[data->phase];  /* left */
        data->phase += 1;
        if( data->phase >= TABLE_SIZE ) data->phase -= TABLE_SIZE;
    }
    return finished;
}